

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O2

int read_header(archive_read *a,archive_entry *entry,char head_type)

{
  undefined4 *puVar1;
  undefined1 uVar2;
  byte bVar3;
  short sVar4;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  void *pvVar8;
  long lVar9;
  archive_entry *paVar10;
  uint uVar11;
  int iVar12;
  wchar_t wVar13;
  uchar *p;
  archive_string_conv *paVar14;
  short *psVar15;
  uLong uVar16;
  uint *buf;
  time_t tVar17;
  void *pvVar18;
  size_t sVar19;
  ulong *puVar20;
  short *psVar21;
  int *piVar22;
  tm *__tp;
  byte bVar23;
  long lVar24;
  long *plVar25;
  undefined7 in_register_00000011;
  char *pcVar26;
  ushort *puVar27;
  ushort *puVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  byte bVar32;
  ulong uVar33;
  char cVar34;
  undefined1 uVar35;
  int iVar36;
  ulong uVar37;
  ushort *puVar38;
  uint uVar39;
  void *pvVar40;
  bool bVar41;
  ushort *local_c8;
  time_t local_b0;
  uint local_a4;
  archive_string_conv *local_a0;
  ulong local_98;
  void *local_90;
  archive_entry *local_88;
  uint local_7c;
  archive_string_conv *local_78;
  ulong *local_70;
  long *local_68;
  ulong *local_60;
  long *local_58;
  ulong *local_50;
  long *local_48;
  ulong *local_40;
  ulong local_38;
  
  pvVar8 = a->format->data;
  paVar14 = *(archive_string_conv **)((long)pvVar8 + 0x4ed8);
  if (paVar14 == (archive_string_conv *)0x0) {
    if (*(int *)((long)pvVar8 + 0x4ec8) == 0) {
      paVar14 = archive_string_default_conversion_for_read(&a->archive);
      *(archive_string_conv **)((long)pvVar8 + 0x4ed0) = paVar14;
      *(undefined4 *)((long)pvVar8 + 0x4ec8) = 1;
    }
    else {
      paVar14 = *(archive_string_conv **)((long)pvVar8 + 0x4ed0);
    }
  }
  psVar15 = (short *)__archive_read_ahead(a,7,(ssize_t *)0x0);
  if (psVar15 == (short *)0x0) {
    return -0x1e;
  }
  local_90 = (void *)CONCAT44(local_90._4_4_,(int)CONCAT71(in_register_00000011,head_type));
  sVar4 = *psVar15;
  uVar30 = (ulong)*(ushort *)((long)psVar15 + 5);
  *(uint *)((long)pvVar8 + 0x18) = (uint)*(ushort *)((long)psVar15 + 3);
  if (uVar30 < 0x20) {
LAB_0017575c:
    pcVar26 = "Invalid header size";
  }
  else {
    local_88 = entry;
    uVar16 = cm_zlib_crc32(0,(uchar *)(psVar15 + 1),5);
    __archive_read_consume(a,7);
    if ((*(byte *)((long)pvVar8 + 0x18) & 0x10) == 0) {
      *(undefined1 *)((long)pvVar8 + 0x17) = 0;
      *(undefined4 *)((long)pvVar8 + 0x40) = 0;
      *(undefined1 (*) [16])((long)pvVar8 + 0x20) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)pvVar8 + 0x30) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)pvVar8 + 0x68) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)pvVar8 + 0x78) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)pvVar8 + 0x88) = (undefined1  [16])0x0;
      *(undefined8 *)((long)pvVar8 + 0x98) = 0;
      local_78 = paVar14;
      buf = (uint *)__archive_read_ahead(a,uVar30 - 7,(ssize_t *)0x0);
      if (buf == (uint *)0x0) {
        return -0x1e;
      }
      uVar16 = cm_zlib_crc32(uVar16,(uchar *)buf,(uint)(uVar30 - 7));
      if (sVar4 == (short)uVar16) {
        uVar29 = *buf;
        uVar37 = (ulong)uVar29;
        uVar39 = buf[1];
        local_38 = (ulong)(byte)buf[2];
        uVar11 = *(uint *)((long)buf + 9);
        iVar12 = *(int *)((long)buf + 0xd);
        uVar5 = *(ushort *)((long)buf + 0x13);
        uVar33 = (ulong)uVar5;
        uVar6 = *(uint *)((long)buf + 0x15);
        *(undefined1 *)((long)pvVar8 + 0x17) = *(undefined1 *)((long)buf + 0x12);
        tVar17 = get_time(iVar12);
        *(time_t *)((long)pvVar8 + 0x30) = tVar17;
        *(ulong *)((long)pvVar8 + 8) = (ulong)uVar11;
        uVar11 = *(uint *)((long)pvVar8 + 0x18);
        if ((uVar11 & 4) != 0) {
          archive_entry_set_is_data_encrypted(local_88,'\x01');
          *(undefined4 *)((long)pvVar8 + 0x4f10) = 1;
          archive_set_error(&a->archive,0x54,"RAR encryption support unavailable.");
          uVar11 = *(uint *)((long)pvVar8 + 0x18);
        }
        if ((uVar11 >> 8 & 1) == 0) {
          pvVar40 = (void *)((long)buf + 0x19);
          *(ulong *)((long)pvVar8 + 0x20) = uVar37;
          *(ulong *)((long)pvVar8 + 0x28) = (ulong)uVar39;
        }
        else {
          uVar11 = *(uint *)((long)buf + 0x19);
          uVar7 = *(uint *)((long)buf + 0x1d);
          uVar37 = CONCAT44(uVar11,uVar29);
          *(ulong *)((long)pvVar8 + 0x20) = uVar37;
          *(ulong *)((long)pvVar8 + 0x28) = CONCAT44(uVar7,uVar39);
          if ((long)((ulong)(uVar7 | uVar11) << 0x20) < 0) {
            pcVar26 = "Invalid sizes specified.";
            goto LAB_00175978;
          }
          pvVar40 = (void *)((long)buf + 0x21);
        }
        *(ulong *)((long)pvVar8 + 0xa8) = uVar37;
        local_a4 = uVar6;
        if ((char)local_90 == 'z') {
          pvVar18 = __archive_read_ahead(a,(uVar37 + uVar30) - 7,(ssize_t *)0x0);
          if (pvVar18 == (void *)0x0) {
            return -0x1e;
          }
          uVar30 = uVar30 + uVar37;
          lVar24 = (long)pvVar18 + uVar30;
          pvVar40 = (void *)(((long)pvVar40 - (long)buf) + (long)pvVar18);
        }
        else {
          lVar24 = (long)buf + uVar30;
        }
        puVar27 = (ushort *)(lVar24 + -7);
        local_c8 = (ushort *)((long)pvVar40 + uVar33);
        if (puVar27 < local_c8) {
          pcVar26 = "Invalid filename size";
          goto LAB_00175978;
        }
        psVar15 = *(short **)((long)pvVar8 + 0x48);
        uVar29 = (uint)uVar5 * 2;
        uVar37 = (ulong)uVar29 + 2;
        if (uVar37 <= *(ulong *)((long)pvVar8 + 0x60)) {
LAB_001759d6:
          memcpy(psVar15,pvVar40,uVar33);
          *(undefined1 *)((long)psVar15 + uVar33) = 0;
          if ((*(byte *)((long)pvVar8 + 0x19) & 2) == 0) {
            while (pcVar26 = strchr((char *)psVar15,0x5c), pcVar26 != (char *)0x0) {
              *pcVar26 = '/';
            }
            local_a0 = local_78;
          }
          else {
            sVar19 = strlen((char *)psVar15);
            if (sVar19 != uVar33) {
              uVar11 = (int)sVar19 + 2;
              uVar2 = *(undefined1 *)((long)pvVar40 + (ulong)((int)sVar19 + 1));
              local_98 = (long)psVar15 + 1;
              uVar39 = 0;
              bVar23 = 0;
              bVar32 = 0;
LAB_00175aa3:
              uVar33 = (ulong)(int)uVar39;
              uVar37 = (ulong)uVar39;
              uVar31 = (ulong)uVar11;
              if ((uVar5 <= uVar11) || (uVar29 <= uVar39)) goto LAB_00175ba3;
              if (bVar23 == 0) {
                uVar11 = uVar11 + 1;
                bVar32 = *(byte *)((long)pvVar40 + uVar31);
                bVar23 = 8;
              }
              bVar23 = bVar23 - 2;
              uVar31 = (ulong)uVar11;
              switch(bVar32 >> (bVar23 & 0x1f) & 3) {
              case 0:
                *(undefined1 *)((long)psVar15 + uVar37) = 0;
                break;
              case 1:
                *(undefined1 *)((long)psVar15 + uVar37) = uVar2;
                break;
              case 2:
                *(undefined1 *)((long)psVar15 + uVar37) =
                     *(undefined1 *)((long)pvVar40 + uVar31 + 1);
                uVar39 = uVar39 + 2;
                *(undefined1 *)((long)psVar15 + uVar33 + 1) =
                     *(undefined1 *)((long)pvVar40 + uVar31);
                uVar11 = uVar11 + 2;
                goto LAB_00175aa3;
              case 3:
                goto switchD_00175ae6_caseD_3;
              }
              uVar11 = uVar11 + 1;
              uVar39 = uVar39 + 2;
              *(undefined1 *)((long)psVar15 + uVar33 + 1) = *(undefined1 *)((long)pvVar40 + uVar31);
              goto LAB_00175aa3;
            }
            local_a0 = *(archive_string_conv **)((long)pvVar8 + 0x4ee0);
            if (local_a0 == (archive_string_conv *)0x0) {
              local_a0 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
              *(archive_string_conv **)((long)pvVar8 + 0x4ee0) = local_a0;
              if (local_a0 == (archive_string_conv *)0x0) {
                return -0x1e;
              }
            }
            while (pcVar26 = strchr((char *)psVar15,0x5c), pcVar26 != (char *)0x0) {
              *pcVar26 = '/';
            }
          }
          uVar39 = (uint)uVar5;
          goto LAB_00175bcf;
        }
        psVar15 = (short *)realloc(psVar15,uVar37);
        if (psVar15 != (short *)0x0) {
          *(short **)((long)pvVar8 + 0x48) = psVar15;
          *(ulong *)((long)pvVar8 + 0x60) = uVar37;
          goto LAB_001759d6;
        }
        pcVar26 = "Couldn\'t allocate memory.";
LAB_00175bbf:
        iVar12 = 0xc;
LAB_0017597a:
        archive_set_error(&a->archive,iVar12,pcVar26);
        return -0x1e;
      }
      pcVar26 = "Header CRC error";
    }
    else {
      pcVar26 = "RAR solid archive support unavailable.";
    }
  }
  iVar12 = 0x54;
LAB_001758bc:
  archive_set_error(&a->archive,iVar12,pcVar26);
  return -0x1e;
LAB_00175ba3:
  if (uVar29 < uVar39) {
    pcVar26 = "Invalid filename";
LAB_00175978:
    iVar12 = 0x54;
    goto LAB_0017597a;
  }
  *(undefined1 *)((long)psVar15 + uVar37) = 0;
  *(undefined1 *)((long)psVar15 + uVar33 + 1) = 0;
  local_a0 = *(archive_string_conv **)((long)pvVar8 + 0x4ee8);
  if (local_a0 == (archive_string_conv *)0x0) {
    local_a0 = archive_string_conversion_from_charset(&a->archive,"UTF-16BE",L'\x01');
    *(archive_string_conv **)((long)pvVar8 + 0x4ee8) = local_a0;
    if (local_a0 == (archive_string_conv *)0x0) {
      return -0x1e;
    }
  }
  uVar39 = uVar39 + 2;
  for (psVar21 = psVar15; *psVar21 != 0; psVar21 = psVar21 + 1) {
    if (*psVar21 == 0x5c00) {
      *(undefined1 *)((long)psVar21 + 1) = 0x2f;
    }
  }
  local_c8 = (ushort *)((long)pvVar40 + uVar31);
LAB_00175bcf:
  pvVar40 = *(void **)((long)pvVar8 + 0x50);
  uVar33 = (ulong)uVar39;
  if (((pvVar40 == (void *)0x0) || (*(ulong *)((long)pvVar8 + 0x58) != uVar33)) ||
     (iVar12 = bcmp(*(void **)((long)pvVar8 + 0x48),pvVar40,(ulong)(uVar39 + 1)), iVar12 != 0)) {
    pvVar40 = realloc(pvVar40,(ulong)(uVar39 + 1));
    *(void **)((long)pvVar8 + 0x50) = pvVar40;
    memcpy(pvVar40,*(void **)((long)pvVar8 + 0x48),(ulong)(uVar39 + 1));
    *(ulong *)((long)pvVar8 + 0x58) = uVar33;
    free(*(void **)((long)pvVar8 + 0x100));
    puVar20 = (ulong *)calloc(1,0x18);
    *(ulong **)((long)pvVar8 + 0x100) = puVar20;
    if (puVar20 != (ulong *)0x0) {
      *puVar20 = uVar30;
      *(undefined4 *)(puVar20 + 1) = 0xffffffff;
      *(undefined4 *)((long)puVar20 + 0xc) = 0xffffffff;
      *(undefined4 *)(puVar20 + 2) = 0xffffffff;
      *(undefined4 *)((long)puVar20 + 0x14) = 0xffffffff;
      *(undefined8 *)((long)pvVar8 + 0x108) = 0x100000000;
      if ((*(uint *)((long)pvVar8 + 0x18) >> 10 & 1) != 0) {
        if (puVar27 < local_c8 + 4) goto LAB_0017575c;
        *(undefined8 *)((long)pvVar8 + 0x68) = *(undefined8 *)local_c8;
        local_c8 = local_c8 + 4;
      }
      if ((*(uint *)((long)pvVar8 + 0x18) >> 0xc & 1) != 0) {
        puVar28 = local_c8 + 1;
        local_98 = uVar33;
        if (puVar27 < puVar28) {
LAB_00175d17:
          pcVar26 = "Invalid header size";
          goto LAB_00175978;
        }
        local_48 = (long *)((long)pvVar8 + 0x80);
        local_58 = (long *)((long)pvVar8 + 0x70);
        local_68 = (long *)((long)pvVar8 + 0x90);
        local_60 = (ulong *)((long)pvVar8 + 0x78);
        local_50 = (ulong *)((long)pvVar8 + 0x88);
        local_40 = (ulong *)((long)pvVar8 + 0x38);
        local_70 = (ulong *)((long)pvVar8 + 0x98);
        uVar29 = (uint)*local_c8;
        local_7c = (uint)*local_c8;
        for (iVar12 = 3; -1 < iVar12; iVar12 = iVar12 + -1) {
          local_b0 = 0;
          bVar41 = true;
          if (iVar12 == 3) {
            local_b0 = *(long *)((long)pvVar8 + 0x30);
            bVar41 = local_b0 == 0;
          }
          uVar39 = uVar29 >> ((char)iVar12 * '\x04' & 0x1fU);
          if ((uVar39 & 8) != 0) {
            puVar38 = puVar28;
            if (bVar41) {
              if (puVar27 < puVar28 + 2) goto LAB_00175d17;
              local_b0 = get_time(*(int *)puVar28);
              puVar38 = puVar28 + 2;
            }
            puVar28 = (ushort *)((long)puVar38 + (ulong)(uVar39 & 3));
            if (puVar27 < puVar28) goto LAB_00175d17;
            uVar29 = 0;
            for (lVar24 = 0; (uVar39 & 3) != (uint)lVar24; lVar24 = lVar24 + 1) {
              uVar29 = uVar29 >> 8 | (int)*(char *)((long)puVar38 + lVar24) << 0x10;
            }
            __tp = localtime(&local_b0);
            iVar36 = __tp->tm_sec;
            if ((uVar39 & 4) != 0) {
              __tp->tm_sec = iVar36 + 1;
              local_b0 = mktime(__tp);
            }
            plVar25 = (long *)((long)pvVar8 + 0x30);
            puVar20 = local_40;
            if (((iVar12 != 3) && (plVar25 = local_48, puVar20 = local_50, iVar12 != 2)) &&
               (plVar25 = local_58, puVar20 = local_60, iVar12 != 1)) {
              plVar25 = local_68;
              puVar20 = local_70;
            }
            *plVar25 = local_b0;
            *puVar20 = (ulong)(iVar36 + uVar29 / 10000000);
            uVar33 = local_98;
            uVar29 = local_7c;
          }
        }
      }
      __archive_read_consume(a,uVar30 - 7);
      lVar24 = a->filter->position;
      lVar9 = *(long *)((long)pvVar8 + 0x100);
      *(long *)(lVar9 + 8) = lVar24;
      *(long *)(lVar9 + 0x10) = lVar24 + *(long *)((long)pvVar8 + 0x20);
      uVar29 = local_a4;
      if (2 < (uint)local_38 - 3) {
        if (2 < (uint)local_38) {
          pcVar26 = "Unknown file attributes from RAR file\'s host OS";
          iVar12 = 0x54;
          goto LAB_0017618c;
        }
        uVar29 = 0x41ed;
        if ((local_a4 & 0x10) == 0) {
          uVar29 = 0x81a4;
        }
      }
      *(uint *)((long)pvVar8 + 0x40) = uVar29;
      *(undefined8 *)((long)pvVar8 + 0xa0) = 0;
      *(undefined8 *)((long)pvVar8 + 0x358) = 0;
      *(undefined4 *)((long)pvVar8 + 0xe8) = 0;
      *(undefined4 *)((long)pvVar8 + 0x4ef8) = 0;
      *(undefined8 *)((long)pvVar8 + 0x4f00) = 0;
      *(undefined8 *)((long)pvVar8 + 0xf0) = 0;
      *(undefined1 *)((long)pvVar8 + 0xed) = 0;
      *(undefined1 (*) [16])((long)pvVar8 + 0xb0) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])((long)pvVar8 + 0xc0) = (undefined1  [16])0x0;
      *(undefined1 *)((long)pvVar8 + 0xd0) = 1;
      *(undefined1 *)((long)pvVar8 + 0x393) = 0;
      *(undefined1 *)((long)pvVar8 + 0x390) = 1;
      free(*(void **)((long)pvVar8 + 0xe0));
      *(undefined8 *)((long)pvVar8 + 0xe0) = 0;
      *(undefined8 *)((long)pvVar8 + 0xd4) = 0x2000000000000;
      memset((void *)((long)pvVar8 + 0x1b0),0,0x194);
      Ppmd7_Free((CPpmd7 *)((long)pvVar8 + 0x398),&g_szalloc);
      paVar10 = local_88;
      *(undefined2 *)((long)pvVar8 + 0x391) = 0;
      if ((char)local_90 == 'z') {
        return 0;
      }
      archive_entry_set_mtime
                (local_88,*(time_t *)((long)pvVar8 + 0x30),*(long *)((long)pvVar8 + 0x38));
      archive_entry_set_ctime
                (paVar10,*(time_t *)((long)pvVar8 + 0x80),*(long *)((long)pvVar8 + 0x88));
      archive_entry_set_atime
                (paVar10,*(time_t *)((long)pvVar8 + 0x70),*(long *)((long)pvVar8 + 0x78));
      archive_entry_set_size(paVar10,*(int64_t *)((long)pvVar8 + 0x28));
      archive_entry_set_mode(paVar10,*(mode_t *)((long)pvVar8 + 0x40));
      paVar14 = local_a0;
      wVar13 = _archive_entry_copy_pathname_l(paVar10,(char *)psVar15,uVar33,local_a0);
      if (wVar13 == L'\0') {
        iVar12 = 0;
      }
      else {
        piVar22 = __errno_location();
        if (*piVar22 == 0xc) {
          pcVar26 = "Can\'t allocate memory for Pathname";
          iVar12 = 0xc;
LAB_0017618c:
          archive_set_error(&a->archive,iVar12,pcVar26);
          return -0x1e;
        }
        iVar12 = -0x14;
        pcVar26 = archive_string_conversion_charset_name(paVar14);
        archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale."
                          ,pcVar26);
      }
      paVar10 = local_88;
      iVar36 = iVar12;
      if ((*(uint *)((long)pvVar8 + 0x40) & 0xf000) != 0xa000) goto LAB_00176285;
      *(undefined8 *)((long)pvVar8 + 0xa8) = 0;
      iVar36 = 0;
      archive_entry_set_size(local_88,0);
      pvVar40 = a->format->data;
      pcVar26 = (char *)rar_read_ahead(a,*(size_t *)((long)pvVar40 + 0x20),(ssize_t *)0x0);
      paVar14 = local_78;
      if (pcVar26 == (char *)0x0) {
        return -0x1e;
      }
      local_90 = pvVar40;
      wVar13 = _archive_entry_copy_symlink_l
                         (paVar10,pcVar26,*(size_t *)((long)pvVar40 + 0x20),local_78);
      if (wVar13 != L'\0') {
        piVar22 = __errno_location();
        if (*piVar22 == 0xc) {
          pcVar26 = "Can\'t allocate memory for link";
          goto LAB_00175bbf;
        }
        pcVar26 = archive_string_conversion_charset_name(paVar14);
        archive_set_error(&a->archive,0x54,"link cannot be converted from %s to current locale.",
                          pcVar26);
        iVar36 = -0x14;
      }
      __archive_read_consume(a,*(int64_t *)((long)local_90 + 0x20));
      if (iVar12 < iVar36) {
        iVar36 = iVar12;
      }
LAB_00176285:
      if (*(long *)((long)pvVar8 + 0xa8) == 0) {
        *(undefined1 *)((long)pvVar8 + 0xed) = 1;
        return iVar36;
      }
      return iVar36;
    }
  }
  else {
    __archive_read_consume(a,uVar30 - 7);
    uVar29 = *(int *)((long)pvVar8 + 0x108) + 1;
    *(uint *)((long)pvVar8 + 0x108) = uVar29;
    if (uVar29 < *(uint *)((long)pvVar8 + 0x10c)) {
      pvVar40 = *(void **)((long)pvVar8 + 0x100);
      uVar33 = (ulong)uVar29;
      if (-1 < *(long *)((long)pvVar40 + uVar33 * 0x18 + 8)) {
        return 0;
      }
LAB_00176148:
      lVar24 = a->filter->position;
      *(long *)((long)pvVar40 + uVar33 * 0x18 + 8) = lVar24;
      *(long *)((long)pvVar40 + uVar33 * 0x18 + 0x10) = lVar24 + *(long *)((long)pvVar8 + 0x20);
      return 0;
    }
    uVar29 = *(uint *)((long)pvVar8 + 0x10c) + 1;
    *(uint *)((long)pvVar8 + 0x10c) = uVar29;
    pvVar40 = realloc(*(void **)((long)pvVar8 + 0x100),(ulong)uVar29 * 0x18);
    *(void **)((long)pvVar8 + 0x100) = pvVar40;
    if (pvVar40 != (void *)0x0) {
      uVar33 = (ulong)*(uint *)((long)pvVar8 + 0x108);
      *(ulong *)((long)pvVar40 + uVar33 * 0x18) = uVar30;
      puVar1 = (undefined4 *)((long)pvVar40 + uVar33 * 0x18 + 8);
      *puVar1 = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar1[2] = 0xffffffff;
      puVar1[3] = 0xffffffff;
      goto LAB_00176148;
    }
  }
  pcVar26 = "Couldn\'t allocate memory.";
  iVar12 = 0xc;
  goto LAB_001758bc;
switchD_00175ae6_caseD_3:
  bVar3 = *(byte *)((long)pvVar40 + uVar31);
  if ((char)bVar3 < '\0') {
    uVar11 = uVar11 + 2;
    cVar34 = *(char *)((long)pvVar40 + uVar31 + 1);
    uVar35 = uVar2;
  }
  else {
    cVar34 = '\0';
    uVar11 = (uint)(uVar31 + 1);
    uVar35 = 0;
  }
  lVar24 = 0;
  for (; ((byte)((bVar3 & 0x7f) + 2) != (char)lVar24 && (uVar39 < uVar29)); uVar39 = uVar39 + 2) {
    *(undefined1 *)(local_98 + uVar33 + -1 + lVar24 * 2) = uVar35;
    *(char *)(local_98 + uVar33 + lVar24 * 2) =
         *(char *)((long)pvVar40 + (ulong)((int)(uVar33 >> 1) + (int)lVar24 & 0x7fffffff)) + cVar34;
    lVar24 = lVar24 + 1;
  }
  goto LAB_00175aa3;
}

Assistant:

static int
read_header(struct archive_read *a, struct archive_entry *entry,
            char head_type)
{
  const void *h;
  const char *p, *endp;
  struct rar *rar;
  struct rar_header rar_header;
  struct rar_file_header file_header;
  int64_t header_size;
  unsigned filename_size, end;
  char *filename;
  char *strp;
  char packed_size[8];
  char unp_size[8];
  int ttime;
  struct archive_string_conv *sconv, *fn_sconv;
  unsigned long crc32_val;
  int ret = (ARCHIVE_OK), ret2;

  rar = (struct rar *)(a->format->data);

  /* Setup a string conversion object for non-rar-unicode filenames. */
  sconv = rar->opt_sconv;
  if (sconv == NULL) {
    if (!rar->init_default_conversion) {
      rar->sconv_default =
          archive_string_default_conversion_for_read(
            &(a->archive));
      rar->init_default_conversion = 1;
    }
    sconv = rar->sconv_default;
  }


  if ((h = __archive_read_ahead(a, 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);
  p = h;
  memcpy(&rar_header, p, sizeof(rar_header));
  rar->file_flags = archive_le16dec(rar_header.flags);
  header_size = archive_le16dec(rar_header.size);
  if (header_size < (int64_t)sizeof(file_header) + 7) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid header size");
    return (ARCHIVE_FATAL);
  }
  crc32_val = crc32(0, (const unsigned char *)p + 2, 7 - 2);
  __archive_read_consume(a, 7);

  if (!(rar->file_flags & FHD_SOLID))
  {
    rar->compression_method = 0;
    rar->packed_size = 0;
    rar->unp_size = 0;
    rar->mtime = 0;
    rar->ctime = 0;
    rar->atime = 0;
    rar->arctime = 0;
    rar->mode = 0;
    memset(&rar->salt, 0, sizeof(rar->salt));
    rar->atime = 0;
    rar->ansec = 0;
    rar->ctime = 0;
    rar->cnsec = 0;
    rar->mtime = 0;
    rar->mnsec = 0;
    rar->arctime = 0;
    rar->arcnsec = 0;
  }
  else
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR solid archive support unavailable.");
    return (ARCHIVE_FATAL);
  }

  if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
    return (ARCHIVE_FATAL);

  /* File Header CRC check. */
  crc32_val = crc32(crc32_val, h, (unsigned)(header_size - 7));
  if ((crc32_val & 0xffff) != archive_le16dec(rar_header.crc)) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Header CRC error");
    return (ARCHIVE_FATAL);
  }
  /* If no CRC error, Go on parsing File Header. */
  p = h;
  endp = p + header_size - 7;
  memcpy(&file_header, p, sizeof(file_header));
  p += sizeof(file_header);

  rar->compression_method = file_header.method;

  ttime = archive_le32dec(file_header.file_time);
  rar->mtime = get_time(ttime);

  rar->file_crc = archive_le32dec(file_header.file_crc);

  if (rar->file_flags & FHD_PASSWORD)
  {
	archive_entry_set_is_data_encrypted(entry, 1);
	rar->has_encrypted_entries = 1;
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "RAR encryption support unavailable.");
    /* Since it is only the data part itself that is encrypted we can at least
       extract information about the currently processed entry and don't need
       to return ARCHIVE_FATAL here. */
    /*return (ARCHIVE_FATAL);*/
  }

  if (rar->file_flags & FHD_LARGE)
  {
    memcpy(packed_size, file_header.pack_size, 4);
    memcpy(packed_size + 4, p, 4); /* High pack size */
    p += 4;
    memcpy(unp_size, file_header.unp_size, 4);
    memcpy(unp_size + 4, p, 4); /* High unpack size */
    p += 4;
    rar->packed_size = archive_le64dec(&packed_size);
    rar->unp_size = archive_le64dec(&unp_size);
  }
  else
  {
    rar->packed_size = archive_le32dec(file_header.pack_size);
    rar->unp_size = archive_le32dec(file_header.unp_size);
  }

  if (rar->packed_size < 0 || rar->unp_size < 0)
  {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Invalid sizes specified.");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_remaining = rar->packed_size;

  /* TODO: RARv3 subblocks contain comments. For now the complete block is
   * consumed at the end.
   */
  if (head_type == NEWSUB_HEAD) {
    size_t distance = p - (const char *)h;
    header_size += rar->packed_size;
    /* Make sure we have the extended data. */
    if ((h = __archive_read_ahead(a, (size_t)header_size - 7, NULL)) == NULL)
        return (ARCHIVE_FATAL);
    p = h;
    endp = p + header_size - 7;
    p += distance;
  }

  filename_size = archive_le16dec(file_header.name_size);
  if (p + filename_size > endp) {
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
      "Invalid filename size");
    return (ARCHIVE_FATAL);
  }
  if (rar->filename_allocated < filename_size * 2 + 2) {
    char *newptr;
    size_t newsize = filename_size * 2 + 2;
    newptr = realloc(rar->filename, newsize);
    if (newptr == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Couldn't allocate memory.");
      return (ARCHIVE_FATAL);
    }
    rar->filename = newptr;
    rar->filename_allocated = newsize;
  }
  filename = rar->filename;
  memcpy(filename, p, filename_size);
  filename[filename_size] = '\0';
  if (rar->file_flags & FHD_UNICODE)
  {
    if (filename_size != strlen(filename))
    {
      unsigned char highbyte, flagbits, flagbyte;
      unsigned fn_end, offset;

      end = filename_size;
      fn_end = filename_size * 2;
      filename_size = 0;
      offset = (unsigned)strlen(filename) + 1;
      highbyte = *(p + offset++);
      flagbits = 0;
      flagbyte = 0;
      while (offset < end && filename_size < fn_end)
      {
        if (!flagbits)
        {
          flagbyte = *(p + offset++);
          flagbits = 8;
        }

        flagbits -= 2;
        switch((flagbyte >> flagbits) & 3)
        {
          case 0:
            filename[filename_size++] = '\0';
            filename[filename_size++] = *(p + offset++);
            break;
          case 1:
            filename[filename_size++] = highbyte;
            filename[filename_size++] = *(p + offset++);
            break;
          case 2:
            filename[filename_size++] = *(p + offset + 1);
            filename[filename_size++] = *(p + offset);
            offset += 2;
            break;
          case 3:
          {
            char extra, high;
            uint8_t length = *(p + offset++);

            if (length & 0x80) {
              extra = *(p + offset++);
              high = (char)highbyte;
            } else
              extra = high = 0;
            length = (length & 0x7f) + 2;
            while (length && filename_size < fn_end) {
              unsigned cp = filename_size >> 1;
              filename[filename_size++] = high;
              filename[filename_size++] = p[cp] + extra;
              length--;
            }
          }
          break;
        }
      }
      if (filename_size > fn_end) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
          "Invalid filename");
        return (ARCHIVE_FATAL);
      }
      filename[filename_size++] = '\0';
      filename[filename_size++] = '\0';

      /* Decoded unicode form is UTF-16BE, so we have to update a string
       * conversion object for it. */
      if (rar->sconv_utf16be == NULL) {
        rar->sconv_utf16be = archive_string_conversion_from_charset(
           &a->archive, "UTF-16BE", 1);
        if (rar->sconv_utf16be == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf16be;

      strp = filename;
      while (memcmp(strp, "\x00\x00", 2))
      {
        if (!memcmp(strp, "\x00\\", 2))
          *(strp + 1) = '/';
        strp += 2;
      }
      p += offset;
    } else {
      /*
       * If FHD_UNICODE is set but no unicode data, this file name form
       * is UTF-8, so we have to update a string conversion object for
       * it accordingly.
       */
      if (rar->sconv_utf8 == NULL) {
        rar->sconv_utf8 = archive_string_conversion_from_charset(
           &a->archive, "UTF-8", 1);
        if (rar->sconv_utf8 == NULL)
          return (ARCHIVE_FATAL);
      }
      fn_sconv = rar->sconv_utf8;
      while ((strp = strchr(filename, '\\')) != NULL)
        *strp = '/';
      p += filename_size;
    }
  }
  else
  {
    fn_sconv = sconv;
    while ((strp = strchr(filename, '\\')) != NULL)
      *strp = '/';
    p += filename_size;
  }

  /* Split file in multivolume RAR. No more need to process header. */
  if (rar->filename_save &&
    filename_size == rar->filename_save_size &&
    !memcmp(rar->filename, rar->filename_save, filename_size + 1))
  {
    __archive_read_consume(a, header_size - 7);
    rar->cursor++;
    if (rar->cursor >= rar->nodes)
    {
      rar->nodes++;
      if ((rar->dbo =
        realloc(rar->dbo, sizeof(*rar->dbo) * rar->nodes)) == NULL)
      {
        archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
        return (ARCHIVE_FATAL);
      }
      rar->dbo[rar->cursor].header_size = header_size;
      rar->dbo[rar->cursor].start_offset = -1;
      rar->dbo[rar->cursor].end_offset = -1;
    }
    if (rar->dbo[rar->cursor].start_offset < 0)
    {
      rar->dbo[rar->cursor].start_offset = a->filter->position;
      rar->dbo[rar->cursor].end_offset = rar->dbo[rar->cursor].start_offset +
        rar->packed_size;
    }
    return ret;
  }

  rar->filename_save = (char*)realloc(rar->filename_save,
                                      filename_size + 1);
  memcpy(rar->filename_save, rar->filename, filename_size + 1);
  rar->filename_save_size = filename_size;

  /* Set info for seeking */
  free(rar->dbo);
  if ((rar->dbo = calloc(1, sizeof(*rar->dbo))) == NULL)
  {
    archive_set_error(&a->archive, ENOMEM, "Couldn't allocate memory.");
    return (ARCHIVE_FATAL);
  }
  rar->dbo[0].header_size = header_size;
  rar->dbo[0].start_offset = -1;
  rar->dbo[0].end_offset = -1;
  rar->cursor = 0;
  rar->nodes = 1;

  if (rar->file_flags & FHD_SALT)
  {
    if (p + 8 > endp) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
    memcpy(rar->salt, p, 8);
    p += 8;
  }

  if (rar->file_flags & FHD_EXTTIME) {
    if (read_exttime(p, rar, endp) < 0) {
      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
        "Invalid header size");
      return (ARCHIVE_FATAL);
    }
  }

  __archive_read_consume(a, header_size - 7);
  rar->dbo[0].start_offset = a->filter->position;
  rar->dbo[0].end_offset = rar->dbo[0].start_offset + rar->packed_size;

  switch(file_header.host_os)
  {
  case OS_MSDOS:
  case OS_OS2:
  case OS_WIN32:
    rar->mode = archive_le32dec(file_header.file_attr);
    if (rar->mode & FILE_ATTRIBUTE_DIRECTORY)
      rar->mode = AE_IFDIR | S_IXUSR | S_IXGRP | S_IXOTH;
    else
      rar->mode = AE_IFREG;
    rar->mode |= S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH;
    break;

  case OS_UNIX:
  case OS_MAC_OS:
  case OS_BEOS:
    rar->mode = archive_le32dec(file_header.file_attr);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unknown file attributes from RAR file's host OS");
    return (ARCHIVE_FATAL);
  }

  rar->bytes_uncopied = rar->bytes_unconsumed = 0;
  rar->lzss.position = rar->offset = 0;
  rar->offset_seek = 0;
  rar->dictionary_size = 0;
  rar->offset_outgoing = 0;
  rar->br.cache_avail = 0;
  rar->br.avail_in = 0;
  rar->crc_calculated = 0;
  rar->entry_eof = 0;
  rar->valid = 1;
  rar->is_ppmd_block = 0;
  rar->start_new_table = 1;
  free(rar->unp_buffer);
  rar->unp_buffer = NULL;
  rar->unp_offset = 0;
  rar->unp_buffer_size = UNP_BUFFER_SIZE;
  memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
  __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
  rar->ppmd_valid = rar->ppmd_eod = 0;

  /* Don't set any archive entries for non-file header types */
  if (head_type == NEWSUB_HEAD)
    return ret;

  archive_entry_set_mtime(entry, rar->mtime, rar->mnsec);
  archive_entry_set_ctime(entry, rar->ctime, rar->cnsec);
  archive_entry_set_atime(entry, rar->atime, rar->ansec);
  archive_entry_set_size(entry, rar->unp_size);
  archive_entry_set_mode(entry, rar->mode);

  if (archive_entry_copy_pathname_l(entry, filename, filename_size, fn_sconv))
  {
    if (errno == ENOMEM)
    {
      archive_set_error(&a->archive, ENOMEM,
                        "Can't allocate memory for Pathname");
      return (ARCHIVE_FATAL);
    }
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Pathname cannot be converted from %s to current locale.",
                      archive_string_conversion_charset_name(fn_sconv));
    ret = (ARCHIVE_WARN);
  }

  if (((rar->mode) & AE_IFMT) == AE_IFLNK)
  {
    /* Make sure a symbolic-link file does not have its body. */
    rar->bytes_remaining = 0;
    archive_entry_set_size(entry, 0);

    /* Read a symbolic-link name. */
    if ((ret2 = read_symlink_stored(a, entry, sconv)) < (ARCHIVE_WARN))
      return ret2;
    if (ret > ret2)
      ret = ret2;
  }

  if (rar->bytes_remaining == 0)
    rar->entry_eof = 1;

  return ret;
}